

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_table.c
# Opt level: O2

aom_codec_err_t
aom_film_grain_table_write
          (aom_film_grain_table_t *t,char *filename,aom_internal_error_info *error_info)

{
  int iVar1;
  aom_film_grain_table_entry_t *paVar2;
  uint uVar3;
  uint uVar4;
  FILE *__s;
  size_t sVar5;
  int i;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  aom_film_grain_t *pars;
  
  error_info->error_code = AOM_CODEC_OK;
  __s = fopen64(filename,"wb");
  if (__s == (FILE *)0x0) {
    aom_internal_error(error_info,AOM_CODEC_ERROR,"Unable to open file %s",filename);
  }
  else {
    sVar5 = fwrite("filmgrn1",8,1,__s);
    if (sVar5 == 0) {
      aom_internal_error(error_info,AOM_CODEC_ERROR,"Unable to write file magic");
      fclose(__s);
    }
    else {
      fputc(10,__s);
      while (paVar2 = t->head, paVar2 != (aom_film_grain_table_entry_t *)0x0) {
        fprintf(__s,"E %ld %ld %d %d %d\n",paVar2->start_time,paVar2->end_time,
                (ulong)(uint)(paVar2->params).apply_grain,(ulong)(paVar2->params).random_seed,
                (ulong)(uint)(paVar2->params).update_parameters);
        if ((paVar2->params).update_parameters != 0) {
          fprintf(__s,"\tp %d %d %d %d %d %d %d %d %d %d %d %d\n",
                  (ulong)(uint)(paVar2->params).ar_coeff_lag,
                  (ulong)(uint)(paVar2->params).ar_coeff_shift,
                  (ulong)(uint)(paVar2->params).grain_scale_shift,
                  (ulong)(uint)(paVar2->params).scaling_shift,
                  (ulong)(uint)(paVar2->params).chroma_scaling_from_luma,
                  (ulong)(uint)(paVar2->params).overlap_flag,(ulong)(uint)(paVar2->params).cb_mult,
                  (ulong)(uint)(paVar2->params).cb_luma_mult,(ulong)(uint)(paVar2->params).cb_offset
                  ,(ulong)(uint)(paVar2->params).cr_mult,(ulong)(uint)(paVar2->params).cr_luma_mult,
                  (ulong)(uint)(paVar2->params).cr_offset);
          fprintf(__s,"\tsY %d ",(ulong)(uint)(paVar2->params).num_y_points);
          for (lVar6 = 0; lVar6 < (paVar2->params).num_y_points; lVar6 = lVar6 + 1) {
            fprintf(__s," %d %d",(ulong)(uint)(paVar2->params).scaling_points_y[lVar6][0],
                    (ulong)(uint)(paVar2->params).scaling_points_y[lVar6][1]);
          }
          fprintf(__s,"\n\tsCb %d",(ulong)(uint)(paVar2->params).num_cb_points);
          for (lVar6 = 0; lVar6 < (paVar2->params).num_cb_points; lVar6 = lVar6 + 1) {
            fprintf(__s," %d %d",(ulong)(uint)(paVar2->params).scaling_points_cb[lVar6][0],
                    (ulong)(uint)(paVar2->params).scaling_points_cb[lVar6][1]);
          }
          fprintf(__s,"\n\tsCr %d",(ulong)(uint)(paVar2->params).num_cr_points);
          for (lVar6 = 0; lVar6 < (paVar2->params).num_cr_points; lVar6 = lVar6 + 1) {
            fprintf(__s," %d %d",(ulong)(uint)(paVar2->params).scaling_points_cr[lVar6][0],
                    (ulong)(uint)(paVar2->params).scaling_points_cr[lVar6][1]);
          }
          fwrite("\n\tcY",4,1,__s);
          iVar1 = (paVar2->params).ar_coeff_lag;
          uVar4 = (iVar1 + 1) * iVar1 * 2;
          uVar7 = 0;
          if (0 < (int)uVar4) {
            uVar7 = (ulong)uVar4;
          }
          for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
            fprintf(__s," %d",(ulong)(uint)(paVar2->params).ar_coeffs_y[uVar8]);
          }
          fwrite("\n\tcCb",5,1,__s);
          uVar3 = uVar4 | 1;
          if ((int)(uVar4 | 1) < 1) {
            uVar3 = 0;
          }
          for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
            fprintf(__s," %d",(ulong)(uint)(paVar2->params).ar_coeffs_cb[uVar7]);
          }
          fwrite("\n\tcCr",5,1,__s);
          for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
            fprintf(__s," %d",(ulong)(uint)(paVar2->params).ar_coeffs_cr[uVar7]);
          }
          fputc(10,__s);
        }
        t = (aom_film_grain_table_t *)&paVar2->next;
      }
      fclose(__s);
    }
  }
  return error_info->error_code;
}

Assistant:

aom_codec_err_t aom_film_grain_table_write(
    const aom_film_grain_table_t *t, const char *filename,
    struct aom_internal_error_info *error_info) {
  error_info->error_code = AOM_CODEC_OK;

  FILE *file = fopen(filename, "wb");
  if (!file) {
    aom_internal_error(error_info, AOM_CODEC_ERROR, "Unable to open file %s",
                       filename);
    return error_info->error_code;
  }

  if (!fwrite(kFileMagic, 8, 1, file)) {
    aom_internal_error(error_info, AOM_CODEC_ERROR,
                       "Unable to write file magic");
    fclose(file);
    return error_info->error_code;
  }

  fprintf(file, "\n");
  aom_film_grain_table_entry_t *entry = t->head;
  while (entry) {
    grain_table_entry_write(file, entry);
    entry = entry->next;
  }
  fclose(file);
  return error_info->error_code;
}